

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

void __thiscall t_html_generator::generate_index(t_html_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  ostream *poVar1;
  int __oflag;
  int __fd;
  vector<t_program_*,_std::allocator<t_program_*>_> programs;
  string index_fname;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::assign((char *)&this->current_file_);
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_58,this);
  std::operator+(&local_38,&local_58,&this->current_file_);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,local_38._M_dataplus._M_p,&local_59);
  this_00 = &this->f_out_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&local_58,__oflag);
  std::__cxx11::string::~string((string *)&local_58);
  poVar1 = std::operator<<((ostream *)this_00,"<!DOCTYPE html>");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"<html lang=\"en\"><head>");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  generate_style_tag(this);
  poVar1 = std::operator<<((ostream *)this_00,"<title>All Thrift declarations</title></head><body>")
  ;
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"<div class=\"container-fluid\">");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"<h1>All Thrift declarations</h1>");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<((ostream *)this_00,
                           "<table class=\"table-bordered table-striped table-condensed\"><thead><tr><th>Module</th><th>Services</th><th>Data types</th>"
                          );
  poVar1 = std::operator<<(poVar1,"<th>Constants</th></tr></thead><tbody>");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  generate_program_toc_rows
            (this,(this->super_t_generator).program_,
             (vector<t_program_*,_std::allocator<t_program_*>_> *)&local_58);
  poVar1 = std::operator<<((ostream *)this_00,"</tbody></table>");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = std::operator<<((ostream *)this_00,"</div></body></html>");
  __fd = 0x36c0b8;
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,__fd);
  std::_Vector_base<t_program_*,_std::allocator<t_program_*>_>::~_Vector_base
            ((_Vector_base<t_program_*,_std::allocator<t_program_*>_> *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void t_html_generator::generate_index() {
  current_file_ = "index.html";
  string index_fname = get_out_dir() + current_file_;
  f_out_.open(index_fname.c_str());
  f_out_ << "<!DOCTYPE html>" << endl << "<html lang=\"en\"><head>" << endl;
  generate_style_tag();
  f_out_ << "<title>All Thrift declarations</title></head><body>" << endl
         << "<div class=\"container-fluid\">" << endl << "<h1>All Thrift declarations</h1>" << endl;
  f_out_ << "<table class=\"table-bordered table-striped "
            "table-condensed\"><thead><tr><th>Module</th><th>Services</th><th>Data types</th>"
         << "<th>Constants</th></tr></thead><tbody>" << endl;
  vector<t_program*> programs;
  generate_program_toc_rows(program_, programs);
  f_out_ << "</tbody></table>" << endl;
  f_out_ << "</div></body></html>" << endl;
  f_out_.close();
}